

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O1

int32_t utrace_vformat_63(char *outBuf,int32_t capacity,int32_t indent,char *fmt,__va_list_tag *args
                         )

{
  uint uVar1;
  UChar *s;
  int32_t iVar2;
  ulong *puVar3;
  int iVar4;
  undefined8 *puVar5;
  byte *pbVar6;
  ulong *puVar7;
  int32_t *piVar8;
  int *piVar9;
  int32_t iVar10;
  ulong uVar11;
  byte c;
  char cVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  char *pcVar17;
  int32_t local_98;
  int32_t local_94;
  ulong local_90;
  ulong local_88;
  char *local_80;
  ulong *local_78;
  int local_6c;
  long local_68;
  ulong *local_60;
  long local_58;
  ulong *local_50;
  ulong *local_48;
  ulong *local_40;
  __va_list_tag *local_38;
  
  local_98 = 0;
  local_6c = 1;
  if (1 < indent) {
    local_6c = indent;
  }
  local_68 = (long)capacity;
  local_6c = -local_6c;
  local_90 = 0;
  iVar13 = 0;
  local_94 = capacity;
  local_80 = fmt;
  local_38 = args;
LAB_002d9841:
  while( true ) {
    iVar16 = iVar13 + 3;
    pcVar17 = local_80 + iVar13;
    lVar14 = (long)iVar13 << 0x20;
    while( true ) {
      iVar10 = local_94;
      lVar14 = lVar14 + 0x100000000;
      cVar12 = *pcVar17;
      if (cVar12 == '%') break;
      outputChar(cVar12,outBuf,&local_98,local_94,indent);
      iVar16 = iVar16 + 1;
      pcVar17 = pcVar17 + 1;
      if (cVar12 == '\0') {
        if ((0 < indent) && (local_98 == 0)) {
          lVar14 = 0;
          local_98 = 0;
          do {
            if (lVar14 < local_68) {
              outBuf[lVar14] = ' ';
            }
            lVar14 = lVar14 + 1;
            local_98 = local_98 + -1;
          } while (-indent != local_98);
          local_98 = -local_98;
        }
        if (local_98 < local_94) {
          outBuf[local_98] = '\0';
        }
        return local_98 + 1;
      }
    }
    iVar13 = iVar16 + -1;
    c = local_80[lVar14 >> 0x20];
    if (0x61 < c) break;
    if (c == 0) {
      iVar13 = iVar16 + -2;
      cVar12 = '%';
LAB_002da06d:
      outputChar(cVar12,outBuf,&local_98,local_94,indent);
    }
    else {
      if (c != 0x53) goto switchD_002d98c8_caseD_65;
      uVar1 = local_38->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar1 + (long)local_38->reg_save_area);
        local_38->gp_offset = uVar1 + 8;
      }
      else {
        puVar5 = (undefined8 *)local_38->overflow_arg_area;
        local_38->overflow_arg_area = puVar5 + 1;
      }
      s = (UChar *)*puVar5;
      uVar1 = local_38->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar8 = (int32_t *)((ulong)uVar1 + (long)local_38->reg_save_area);
        local_38->gp_offset = uVar1 + 8;
      }
      else {
        piVar8 = (int32_t *)local_38->overflow_arg_area;
        local_38->overflow_arg_area = piVar8 + 2;
      }
      outputUString(s,*piVar8,outBuf,&local_98,local_94,indent);
    }
  }
  switch(c) {
  case 0x62:
    uVar1 = local_38->gp_offset;
    local_88 = CONCAT44(local_88._4_4_,iVar13);
    if ((ulong)uVar1 < 0x29) {
      piVar9 = (int *)((ulong)uVar1 + (long)local_38->reg_save_area);
      local_38->gp_offset = uVar1 + 8;
    }
    else {
      piVar9 = (int *)local_38->overflow_arg_area;
      local_38->overflow_arg_area = piVar9 + 2;
    }
    iVar13 = *piVar9;
    lVar14 = 4;
    do {
      outputChar("0123456789abcdef"[(uint)((long)iVar13 >> ((byte)lVar14 & 0x3f)) & 0xf],outBuf,
                 &local_98,iVar10,0);
      lVar14 = lVar14 + -4;
      uVar11 = local_90;
    } while (lVar14 != -4);
    break;
  case 99:
    uVar1 = local_38->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      pbVar6 = (byte *)((ulong)uVar1 + (long)local_38->reg_save_area);
      local_38->gp_offset = uVar1 + 8;
    }
    else {
      pbVar6 = (byte *)local_38->overflow_arg_area;
      local_38->overflow_arg_area = pbVar6 + 8;
    }
    c = *pbVar6;
    goto LAB_002d9ad5;
  case 100:
    uVar1 = local_38->gp_offset;
    local_88 = CONCAT44(local_88._4_4_,iVar13);
    if ((ulong)uVar1 < 0x29) {
      piVar9 = (int *)((ulong)uVar1 + (long)local_38->reg_save_area);
      local_38->gp_offset = uVar1 + 8;
    }
    else {
      piVar9 = (int *)local_38->overflow_arg_area;
      local_38->overflow_arg_area = piVar9 + 2;
    }
    iVar13 = *piVar9;
    lVar14 = 0x1c;
    do {
      outputChar("0123456789abcdef"[(uint)((long)iVar13 >> ((byte)lVar14 & 0x3f)) & 0xf],outBuf,
                 &local_98,iVar10,0);
      lVar14 = lVar14 + -4;
      uVar11 = local_90;
    } while (lVar14 != -4);
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
switchD_002d98c8_caseD_65:
LAB_002d9ad5:
    outputChar(c,outBuf,&local_98,local_94,indent);
    goto LAB_002d9841;
  case 0x68:
    uVar1 = local_38->gp_offset;
    local_88 = CONCAT44(local_88._4_4_,iVar13);
    if ((ulong)uVar1 < 0x29) {
      piVar9 = (int *)((ulong)uVar1 + (long)local_38->reg_save_area);
      local_38->gp_offset = uVar1 + 8;
    }
    else {
      piVar9 = (int *)local_38->overflow_arg_area;
      local_38->overflow_arg_area = piVar9 + 2;
    }
    iVar13 = *piVar9;
    lVar14 = 0xc;
    do {
      outputChar("0123456789abcdef"[(uint)((long)iVar13 >> ((byte)lVar14 & 0x3f)) & 0xf],outBuf,
                 &local_98,iVar10,0);
      lVar14 = lVar14 + -4;
      uVar11 = local_90;
    } while (lVar14 != -4);
    break;
  case 0x6c:
    local_88 = CONCAT44(local_88._4_4_,iVar13);
    uVar1 = local_38->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar7 = (ulong *)((ulong)uVar1 + (long)local_38->reg_save_area);
      local_38->gp_offset = uVar1 + 8;
    }
    else {
      puVar7 = (ulong *)local_38->overflow_arg_area;
      local_38->overflow_arg_area = puVar7 + 1;
    }
    uVar11 = *puVar7;
    lVar14 = 0x3c;
    do {
      outputChar("0123456789abcdef"[(uint)((long)uVar11 >> ((byte)lVar14 & 0x3f)) & 0xf],outBuf,
                 &local_98,iVar10,0);
      lVar14 = lVar14 + -4;
    } while (lVar14 != -4);
    break;
  case 0x70:
    uVar1 = local_38->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar5 = (undefined8 *)((ulong)uVar1 + (long)local_38->reg_save_area);
      local_38->gp_offset = uVar1 + 8;
    }
    else {
      puVar5 = (undefined8 *)local_38->overflow_arg_area;
      local_38->overflow_arg_area = puVar5 + 1;
    }
    outputPtrBytes((void *)*puVar5,outBuf,&local_98,local_94);
    goto LAB_002d9841;
  default:
    if (c != 0x73) {
      if (c == 0x76) {
        local_88 = (ulong)(byte)local_80[iVar13];
        if (local_80[iVar13] == 0) {
          iVar16 = iVar13;
        }
        uVar1 = local_38->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar5 = (undefined8 *)((ulong)uVar1 + (long)local_38->reg_save_area);
          local_38->gp_offset = uVar1 + 8;
        }
        else {
          puVar5 = (undefined8 *)local_38->overflow_arg_area;
          local_38->overflow_arg_area = puVar5 + 1;
        }
        local_78 = (ulong *)*puVar5;
        uVar1 = local_38->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar9 = (int *)((ulong)uVar1 + (long)local_38->reg_save_area);
          local_38->gp_offset = uVar1 + 8;
        }
        else {
          piVar9 = (int *)local_38->overflow_arg_area;
          local_38->overflow_arg_area = piVar9 + 2;
        }
        iVar13 = *piVar9;
        lVar14 = (long)iVar13;
        local_58 = lVar14;
        if (local_78 == (ulong *)0x0) {
          lVar15 = 0;
          do {
            pcVar17 = "*NULL* " + lVar15;
            lVar15 = lVar15 + 1;
            outputChar(*pcVar17,outBuf,&local_98,iVar10,indent);
            uVar11 = local_90;
            lVar14 = local_58;
          } while (lVar15 != 8);
        }
        else {
          uVar11 = local_90;
          if (iVar13 == -1 || 0 < iVar13) {
            iVar13 = 0;
            iVar10 = 0;
            local_60 = local_78;
            local_50 = local_78;
            local_48 = local_78;
            local_40 = local_78;
            do {
              puVar3 = local_60;
              puVar7 = local_78;
              iVar2 = local_94;
              iVar4 = (int)local_88;
              switch(iVar4) {
              case 0x62:
                uVar11 = (ulong)(char)*local_60;
                local_60 = (ulong *)((long)local_60 + 1);
                iVar10 = 2;
                break;
              case 99:
                outputChar((char)*local_60,outBuf,&local_98,local_94,indent);
                uVar11 = (ulong)(char)*puVar3;
                local_60 = (ulong *)((long)puVar3 + 1);
                goto LAB_002d9ef7;
              case 100:
                uVar11 = (ulong)(int)*local_48;
                local_48 = (ulong *)((long)local_48 + 4);
                iVar10 = 8;
                break;
              case 0x65:
              case 0x66:
              case 0x67:
              case 0x69:
              case 0x6a:
              case 0x6b:
              case 0x6d:
              case 0x6e:
              case 0x6f:
                break;
              case 0x68:
                uVar11 = (ulong)(short)*local_50;
                local_50 = (ulong *)((long)local_50 + 2);
                iVar10 = 4;
                break;
              case 0x6c:
                uVar11 = *local_40;
                local_40 = local_40 + 1;
                iVar10 = 0x10;
                break;
              case 0x70:
                outputPtrBytes((void *)*local_78,outBuf,&local_98,local_94);
                uVar11 = (ulong)(*puVar7 != 0);
                local_78 = puVar7 + 1;
                goto LAB_002d9ef7;
              default:
                if (iVar4 == 0x53) {
                  local_90 = CONCAT44(local_90._4_4_,iVar13);
                  outputUString((UChar *)*local_78,-1,outBuf,&local_98,local_94,indent);
                  iVar13 = (int)local_90;
                  if (local_98 == 0) {
                    if (0 < indent) goto LAB_002d9e79;
                  }
                  else if (0 < indent && iVar2 <= local_98) {
LAB_002d9e79:
                    lVar15 = (long)local_98;
                    iVar13 = 0;
                    do {
                      if (lVar15 < local_68) {
                        outBuf[lVar15] = ' ';
                      }
                      lVar15 = lVar15 + 1;
                      iVar13 = iVar13 + -1;
                    } while (local_6c != iVar13);
LAB_002d9ec9:
                    local_98 = local_98 - iVar13;
                    iVar13 = (int)local_90;
                  }
                }
                else {
                  if (iVar4 != 0x73) break;
                  local_90 = CONCAT44(local_90._4_4_,iVar13);
                  pcVar17 = (char *)*local_78;
                  if (pcVar17 == (char *)0x0) {
                    pcVar17 = "*NULL*";
                  }
                  do {
                    cVar12 = *pcVar17;
                    outputChar(cVar12,outBuf,&local_98,iVar2,indent);
                    pcVar17 = pcVar17 + 1;
                  } while (cVar12 != '\0');
                  lVar14 = local_58;
                  iVar13 = (int)local_90;
                  if (local_98 == 0) {
                    if (0 < indent) goto LAB_002d9eae;
                  }
                  else if (0 < indent && iVar2 <= local_98) {
LAB_002d9eae:
                    lVar15 = (long)local_98;
                    iVar13 = 0;
                    do {
                      if (lVar15 < local_68) {
                        outBuf[lVar15] = ' ';
                      }
                      lVar15 = lVar15 + 1;
                      iVar13 = iVar13 + -1;
                    } while (local_6c != iVar13);
                    goto LAB_002d9ec9;
                  }
                }
                if (local_98 < iVar2) {
                  outBuf[local_98] = '\n';
                }
                local_98 = local_98 + 1;
                uVar11 = (ulong)(*local_78 != 0);
                local_78 = local_78 + 1;
LAB_002d9ef7:
                iVar10 = 0;
              }
              iVar2 = local_94;
              if (iVar10 != 0) {
                local_90 = uVar11;
                outputHexBytes(uVar11,iVar10,outBuf,&local_98,local_94);
                lVar14 = local_58;
                outputChar(' ',outBuf,&local_98,iVar2,indent);
                uVar11 = local_90;
              }
              iVar4 = (int)lVar14;
              if ((iVar4 == -1) && (uVar11 == 0)) {
                uVar11 = 0;
                break;
              }
              iVar13 = iVar13 + 1;
            } while (iVar4 == -1 || iVar13 < iVar4);
          }
        }
        local_90 = uVar11;
        outputChar('[',outBuf,&local_98,local_94,indent);
        lVar15 = 0x1c;
        do {
          outputChar("0123456789abcdef"[(uint)(lVar14 >> ((byte)lVar15 & 0x3f)) & 0xf],outBuf,
                     &local_98,local_94,0);
          lVar15 = lVar15 + -4;
        } while (lVar15 != -4);
        cVar12 = ']';
        iVar13 = iVar16;
        goto LAB_002da06d;
      }
      goto switchD_002d98c8_caseD_65;
    }
    uVar1 = local_38->gp_offset;
    local_88 = CONCAT44(local_88._4_4_,iVar13);
    if ((ulong)uVar1 < 0x29) {
      puVar5 = (undefined8 *)((ulong)uVar1 + (long)local_38->reg_save_area);
      local_38->gp_offset = uVar1 + 8;
    }
    else {
      puVar5 = (undefined8 *)local_38->overflow_arg_area;
      local_38->overflow_arg_area = puVar5 + 1;
    }
    pcVar17 = (char *)*puVar5;
    if (pcVar17 == (char *)0x0) {
      pcVar17 = "*NULL*";
    }
    do {
      cVar12 = *pcVar17;
      outputChar(cVar12,outBuf,&local_98,iVar10,indent);
      pcVar17 = pcVar17 + 1;
      uVar11 = local_90;
    } while (cVar12 != '\0');
  }
  local_90 = uVar11;
  iVar13 = (int)local_88;
  goto LAB_002d9841;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrace_vformat(char *outBuf, int32_t capacity, int32_t indent, const char *fmt, va_list args) {
    int32_t   outIx  = 0;
    int32_t   fmtIx  = 0;
    char      fmtC;
    char      c;
    int32_t   intArg;
    int64_t   longArg = 0;
    char      *ptrArg;

    /*   Loop runs once for each character in the format string.
     */
    for (;;) {
        fmtC = fmt[fmtIx++];
        if (fmtC != '%') {
            /* Literal character, not part of a %sequence.  Just copy it to the output. */
            outputChar(fmtC, outBuf, &outIx, capacity, indent);
            if (fmtC == 0) {
                /* We hit the null that terminates the format string.
                 * This is the normal (and only) exit from the loop that
                 * interprets the format
                 */
                break;
            }
            continue;
        }

        /* We encountered a '%'.  Pick up the following format char */
        fmtC = fmt[fmtIx++];

        switch (fmtC) {
        case 'c':
            /* single 8 bit char   */
            c = (char)va_arg(args, int32_t);
            outputChar(c, outBuf, &outIx, capacity, indent);
            break;

        case 's':
            /* char * string, null terminated.  */
            ptrArg = va_arg(args, char *);
            outputString((const char *)ptrArg, outBuf, &outIx, capacity, indent);
            break;

        case 'S':
            /* UChar * string, with length, len==-1 for null terminated. */
            ptrArg = va_arg(args, char *);             /* Ptr    */
            intArg =(int32_t)va_arg(args, int32_t);    /* Length */
            outputUString((const UChar *)ptrArg, intArg, outBuf, &outIx, capacity, indent);
            break;

        case 'b':
            /*  8 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 2, outBuf, &outIx, capacity);
            break;

        case 'h':
            /*  16 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 4, outBuf, &outIx, capacity);
            break;

        case 'd':
            /*  32 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 8, outBuf, &outIx, capacity);
            break;

        case 'l':
            /*  64 bit long  */
            longArg = va_arg(args, int64_t);
            outputHexBytes(longArg, 16, outBuf, &outIx, capacity);
            break;
            
        case 'p':
            /*  Pointers.   */
            ptrArg = va_arg(args, char *);
            outputPtrBytes(ptrArg, outBuf, &outIx, capacity);
            break;

        case 0:
            /* Single '%' at end of fmt string.  Output as literal '%'.   
             * Back up index into format string so that the terminating null will be
             * re-fetched in the outer loop, causing it to terminate.
             */
            outputChar('%', outBuf, &outIx, capacity, indent);
            fmtIx--;
            break;

        case 'v':
            {
                /* Vector of values, e.g. %vh */
                char     vectorType;
                int32_t  vectorLen;
                const char   *i8Ptr;
                int16_t  *i16Ptr;
                int32_t  *i32Ptr;
                int64_t  *i64Ptr;
                void     **ptrPtr;
                int32_t   charsToOutput = 0;
                int32_t   i;
                
                vectorType = fmt[fmtIx];    /* b, h, d, l, p, etc. */
                if (vectorType != 0) {
                    fmtIx++;
                }
                i8Ptr = (const char *)va_arg(args, void*);
                i16Ptr = (int16_t *)i8Ptr;
                i32Ptr = (int32_t *)i8Ptr;
                i64Ptr = (int64_t *)i8Ptr;
                ptrPtr = (void **)i8Ptr;
                vectorLen =(int32_t)va_arg(args, int32_t);
                if (ptrPtr == NULL) {
                    outputString("*NULL* ", outBuf, &outIx, capacity, indent);
                } else {
                    for (i=0; i<vectorLen || vectorLen==-1; i++) { 
                        switch (vectorType) {
                        case 'b':
                            charsToOutput = 2;
                            longArg = *i8Ptr++;
                            break;
                        case 'h':
                            charsToOutput = 4;
                            longArg = *i16Ptr++;
                            break;
                        case 'd':
                            charsToOutput = 8;
                            longArg = *i32Ptr++;
                            break;
                        case 'l':
                            charsToOutput = 16;
                            longArg = *i64Ptr++;
                            break;
                        case 'p':
                            charsToOutput = 0;
                            outputPtrBytes(*ptrPtr, outBuf, &outIx, capacity);
                            longArg = *ptrPtr==NULL? 0: 1;    /* test for null terminated array. */
                            ptrPtr++;
                            break;
                        case 'c':
                            charsToOutput = 0;
                            outputChar(*i8Ptr, outBuf, &outIx, capacity, indent);
                            longArg = *i8Ptr;    /* for test for null terminated array. */
                            i8Ptr++;
                            break;
                        case 's':
                            charsToOutput = 0;
                            outputString((const char *)*ptrPtr, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                        case 'S':
                            charsToOutput = 0;
                            outputUString((const UChar *)*ptrPtr, -1, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                            
                        }
                        if (charsToOutput > 0) {
                            outputHexBytes(longArg, charsToOutput, outBuf, &outIx, capacity);
                            outputChar(' ', outBuf, &outIx, capacity, indent);
                        }
                        if (vectorLen == -1 && longArg == 0) {
                            break;
                        }
                    }
                }
                outputChar('[', outBuf, &outIx, capacity, indent);
                outputHexBytes(vectorLen, 8, outBuf, &outIx, capacity);
                outputChar(']', outBuf, &outIx, capacity, indent);
            }
            break;


        default:
            /* %. in format string, where . is some character not in the set
             *    of recognized format chars.  Just output it as if % wasn't there.
             *    (Covers "%%" outputing a single '%')
             */
             outputChar(fmtC, outBuf, &outIx, capacity, indent);
        }
    }
    outputChar(0, outBuf, &outIx, capacity, indent);  /* Make sure that output is null terminated  */
    return outIx + 1;     /* outIx + 1 because outIx does not increment when outputing final null. */
}